

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_common.h
# Opt level: O0

bool date::
     read<std::istreambuf_iterator<char,std::char_traits<char>>,date::optional_t<date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>>,date::unsigned_integer_t<unsigned_char,1u,2u>,date::character_t<char>,date::aliases_t<char,4ul,unsigned_char,12ul>,date::character_t<char>,date::unsigned_integer_t<unsigned_short,2u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>,date::character_t<char>,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>>
               (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
               istreambuf_iterator<char,_std::char_traits<char>_> *end,
               tuple<date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
               *format)

{
  bool bVar1;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *piVar2;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *piVar3;
  undefined1 local_a0 [8];
  input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true> wrapper;
  tuple<date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
  *format_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *end_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *pos_local;
  
  wrapper.m_proxyEnd.m_position = (size_t)format;
  input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true>::
  input_wrapper_t((input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true>
                   *)local_a0,pos,end);
  piVar2 = input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true>::
           begin((input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true>
                  *)local_a0);
  piVar3 = input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true>::end
                     ((input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true>
                       *)local_a0);
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,std::tuple<date::optional_t<date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>>,date::unsigned_integer_t<unsigned_char,1u,2u>,date::character_t<char>,date::aliases_t<char,4ul,unsigned_char,12ul>,date::character_t<char>,date::unsigned_integer_t<unsigned_short,2u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>,date::character_t<char>,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul>
                    (piVar2,piVar3,wrapper.m_proxyEnd.m_position);
  return bVar1;
}

Assistant:

bool read(Iterator& pos, const Iterator& end, std::tuple<Formatters...>& format)
{
    enum : unsigned { max_length = args_traits<Formatters...>::max_length };
    enum : bool { need_cache = args_traits<Formatters...>::need_cache && input_traits<Iterator>::need_cache };
    
    input_wrapper_t<Iterator, max_length, need_cache> wrapper(pos, end);
    return read_impl(wrapper.begin(), wrapper.end(), format, std_impl::make_index_sequence<sizeof...(Formatters)>{});
}